

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

bool __thiscall sf::Font::loadFromMemory(Font *this,void *data,size_t sizeInBytes)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  undefined8 in_RDX;
  EVP_PKEY_CTX *in_RSI;
  Font *in_RDI;
  FT_Stroker stroker;
  FT_Face_conflict face;
  FT_Library library;
  bool local_5a;
  allocator local_59;
  string local_58 [32];
  void *local_38;
  void *local_30;
  void *local_28;
  undefined8 local_20;
  EVP_PKEY_CTX *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  cleanup(in_RDI,in_RSI);
  piVar3 = (int *)operator_new(4);
  *piVar3 = 1;
  in_RDI->m_refCount = piVar3;
  iVar2 = FT_Init_FreeType(&local_28);
  if (iVar2 == 0) {
    in_RDI->m_library = local_28;
    iVar2 = FT_New_Memory_Face(in_RDI->m_library,local_18,local_20,0,&local_30);
    if (iVar2 == 0) {
      iVar2 = FT_Stroker_New(in_RDI->m_library,&local_38);
      if (iVar2 == 0) {
        iVar2 = FT_Select_Charmap(local_30,0x756e6963);
        if (iVar2 == 0) {
          in_RDI->m_stroker = local_38;
          in_RDI->m_face = local_30;
          local_5a = *(long *)((long)local_30 + 0x28) == 0;
          if (local_5a) {
            std::__cxx11::string::string(local_58);
          }
          else {
            pcVar1 = *(char **)((long)local_30 + 0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_58,pcVar1,&local_59);
          }
          local_5a = !local_5a;
          std::__cxx11::string::operator=((string *)&in_RDI->m_info,local_58);
          std::__cxx11::string::~string(local_58);
          if (local_5a) {
            std::allocator<char>::~allocator((allocator<char> *)&local_59);
          }
          local_1 = true;
        }
        else {
          poVar4 = err();
          poVar4 = std::operator<<(poVar4,
                                   "Failed to load font from memory (failed to set the Unicode character set)"
                                  );
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          FT_Stroker_Done(local_38);
          FT_Done_Face(local_30);
          local_1 = false;
        }
      }
      else {
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,
                                 "Failed to load font from memory (failed to create the stroker)");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        FT_Done_Face(local_30);
        local_1 = false;
      }
    }
    else {
      poVar4 = err();
      poVar4 = std::operator<<(poVar4,
                               "Failed to load font from memory (failed to create the font face)");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
  }
  else {
    poVar4 = err();
    poVar4 = std::operator<<(poVar4,
                             "Failed to load font from memory (failed to initialize FreeType)");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Font::loadFromMemory(const void* data, std::size_t sizeInBytes)
{
    // Cleanup the previous resources
    cleanup();
    m_refCount = new int(1);

    // Initialize FreeType
    // Note: we initialize FreeType for every font instance in order to avoid having a single
    // global manager that would create a lot of issues regarding creation and destruction order.
    FT_Library library;
    if (FT_Init_FreeType(&library) != 0)
    {
        err() << "Failed to load font from memory (failed to initialize FreeType)" << std::endl;
        return false;
    }
    m_library = library;

    // Load the new font face from the specified file
    FT_Face face;
    if (FT_New_Memory_Face(static_cast<FT_Library>(m_library), reinterpret_cast<const FT_Byte*>(data), static_cast<FT_Long>(sizeInBytes), 0, &face) != 0)
    {
        err() << "Failed to load font from memory (failed to create the font face)" << std::endl;
        return false;
    }

    // Load the stroker that will be used to outline the font
    FT_Stroker stroker;
    if (FT_Stroker_New(static_cast<FT_Library>(m_library), &stroker) != 0)
    {
        err() << "Failed to load font from memory (failed to create the stroker)" << std::endl;
        FT_Done_Face(face);
        return false;
    }

    // Select the Unicode character map
    if (FT_Select_Charmap(face, FT_ENCODING_UNICODE) != 0)
    {
        err() << "Failed to load font from memory (failed to set the Unicode character set)" << std::endl;
        FT_Stroker_Done(stroker);
        FT_Done_Face(face);
        return false;
    }

    // Store the loaded font in our ugly void* :)
    m_stroker = stroker;
    m_face = face;

    // Store the font information
    m_info.family = face->family_name ? face->family_name : std::string();

    return true;
}